

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String __thiscall testing::internal::String::ShowCStringQuoted(String *this,char *c_str)

{
  char *pcVar1;
  size_t extraout_RDX;
  String SVar3;
  size_t sVar2;
  
  if (c_str == (char *)0x0) {
    pcVar1 = (char *)operator_new__(7);
    builtin_strncpy(pcVar1,"(null)",7);
    this->c_str_ = pcVar1;
    this->length_ = 6;
    sVar2 = extraout_RDX;
  }
  else {
    SVar3 = Format((char *)this,"\"%s\"",c_str);
    sVar2 = SVar3.length_;
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String String::ShowCStringQuoted(const char* c_str) {
  return c_str ? String::Format("\"%s\"", c_str) : String("(null)");
}